

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_IgnoreTransitiveFeature_Test::
FeaturesTest_IgnoreTransitiveFeature_Test(FeaturesTest_IgnoreTransitiveFeature_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_01884b50;
  DescriptorPool::DescriptorPool(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_0187fc28;
  return;
}

Assistant:

TEST_F(FeaturesTest, IgnoreTransitiveFeature) {
  pool_.AddDirectInputFile("bar.proto");
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  BuildFileWithWarnings(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        dependency: "google/protobuf/unittest_features.proto"
        options {
          uninterpreted_option {
            name { name_part: "features" is_extension: false }
            name { name_part: "pb.test" is_extension: true }
            name { name_part: "removed_feature" is_extension: false }
            identifier_value: "VALUE9"
          }
        }
        message_type { name: "Foo" }
      )pb",
      "");
  BuildFileWithWarnings(
      R"pb(
        name: "bar.proto"
        syntax: "editions"
        edition: EDITION_2023
        dependency: "foo.proto"
        message_type {
          name: "Bar"
          field {
            name: "bar"
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_MESSAGE
            type_name: ".Foo"
          }
        }
      )pb",
      "");
}